

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O2

size_t portability_path_get_name(char *path,size_t path_size,char *name,size_t name_size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (name != (char *)0x0 && path != (char *)0x0) {
    uVar3 = 0;
    uVar2 = 0;
    uVar4 = 0;
    while (((uVar3 < path_size && (path[uVar3] != '\0')) && (uVar2 < name_size))) {
      name[uVar2] = path[uVar3];
      if (path[uVar3] == '/') {
        uVar1 = 0;
      }
      else {
        uVar1 = uVar2 + 1;
        if (((path[uVar3] == '.') && (uVar4 = uVar2, uVar3 != 0)) && (path[uVar3 - 1] == '.')) {
          uVar4 = 0;
          uVar1 = 0;
        }
      }
      uVar2 = uVar1;
      uVar3 = uVar3 + 1;
    }
    if (uVar2 < 2) {
      uVar2 = uVar4;
    }
    if (uVar4 != 0) {
      uVar2 = uVar4;
    }
    name[uVar2] = '\0';
    return uVar2 + 1;
  }
  return 0;
}

Assistant:

size_t portability_path_get_name(const char *path, size_t path_size, char *name, size_t name_size)
{
	if (path == NULL || name == NULL)
	{
		return 0;
	}

	size_t i, count, last;

	for (i = 0, count = 0, last = 0; path[i] != '\0' && i < path_size && count < name_size; ++i)
	{
		name[count++] = path[i];

		if (PORTABILITY_PATH_SEPARATOR(path[i]))
		{
			count = 0;
		}
		else if (path[i] == '.')
		{
			if (i > 0 && path[i - 1] == '.')
			{
				last = 0;
				count = 0;
			}
			else
			{
				if (count > 0)
				{
					last = count - 1;
				}
				else
				{
					last = 0;
				}
			}
		}
	}

	if (last == 0 && count > 1)
	{
		last = count;
	}

	name[last] = '\0';

	return last + 1;
}